

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phi_sum.cpp
# Opt level: O0

int256_t * primesum::phi_sum(int128_t x,int64_t a)

{
  long lVar1;
  undefined1 x_00 [16];
  ulong uVar2;
  long in_RCX;
  long in_RDX;
  ulong in_RSI;
  int256_t *in_RDI;
  array<int,_10UL> *in_stack_00000100;
  int64_t in_stack_00000108;
  undefined1 in_stack_00000110 [16];
  undefined8 in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff20;
  vector<int,_std::allocator<int>_> *this;
  int64_t in_stack_ffffffffffffff58;
  pointer in_stack_ffffffffffffff90;
  int64_t in_stack_ffffffffffffff98;
  
  uVar2 = std::numeric_limits<long>::max();
  lVar1 = ((long)uVar2 >> 0x3f) - in_RDX;
  if ((SBORROW8((long)uVar2 >> 0x3f,in_RDX) != SBORROW8(lVar1,(ulong)(uVar2 < in_RSI))) ==
      (long)(lVar1 - (ulong)(uVar2 < in_RSI)) < 0) {
    phi_sum(in_stack_ffffffffffffff98,(int64_t)in_stack_ffffffffffffff90);
    x_00._8_8_ = in_stack_ffffffffffffff20;
    x_00._0_8_ = in_stack_ffffffffffffff18;
    int256_t::int256_t<__int128,void>(in_RDI,(__int128)x_00);
  }
  else if (in_RCX < 10) {
    (anonymous_namespace)::phi_sum256<1,std::array<int,10ul>const&>
              ((int128_t)in_stack_00000110,in_stack_00000108,in_stack_00000100);
  }
  else {
    this = (vector<int,_std::allocator<int>_> *)&stack0xffffffffffffff80;
    generate_n_primes(in_stack_ffffffffffffff58);
    (anonymous_namespace)::phi_sum256<1,std::vector<int,std::allocator<int>>>
              ((int128_t)in_stack_00000110,in_stack_00000108,
               (vector<int,_std::allocator<int>_> *)in_stack_00000100);
    std::vector<int,_std::allocator<int>_>::~vector(this);
  }
  return in_RDI;
}

Assistant:

int256_t phi_sum(int128_t x, int64_t a)
{
  if (x <= numeric_limits<int64_t>::max())
    return phi_sum((int64_t) x, a);

  if (a < 10)
    return phi_sum256<1>(x, a, small_primes_);
  else
    return phi_sum256<1>(x, a, generate_n_primes(a));
}